

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::V1MessageLite::_InternalSerialize
          (V1MessageLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *data;
  bool bVar1;
  anon_union_16_1_493b367e_for_V1MessageLite_3 aVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  
  aVar2 = this->field_0;
  if (((undefined1  [16])aVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.int_field_,target);
  }
  if (((undefined1  [16])aVar2 & (undefined1  [16])0x2) != (undefined1  [16])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.enum_field_;
    pbVar3 = target + 1;
    *target = 0x10;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar3 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar3 = (byte)uVar5;
    target = pbVar3 + 1;
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffe) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar7 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar7 = (undefined8 *)((uVar6 & 0xfffffffffffffffe) + 8);
    }
    size = *(uint *)(puVar7 + 1);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL V1MessageLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const V1MessageLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.V1MessageLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 int_field = 1 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_int_field(), target);
  }

  // .proto2_unittest.V1EnumLite enum_field = 2 [default = V1_FIRST];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_enum_field(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.V1MessageLite)
  return target;
}